

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing.h
# Opt level: O0

void AssertEqual<HttpResult::Code,HttpResult::Code>
               (Code *actual,Code *expected,char *fileName,int lineNumber)

{
  ostream *poVar1;
  AssertionException *this;
  char *message;
  stringstream local_1b0 [8];
  stringstream msg;
  ostream local_1a0 [380];
  int local_24;
  char *pcStack_20;
  int lineNumber_local;
  char *fileName_local;
  Code *expected_local;
  Code *actual_local;
  
  if (*expected != *actual) {
    local_24 = lineNumber;
    pcStack_20 = fileName;
    fileName_local = (char *)expected;
    expected_local = actual;
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,"Equality assumption is broken: file \'");
    poVar1 = std::operator<<(poVar1,pcStack_20);
    poVar1 = std::operator<<(poVar1,"\'; line ");
    std::ostream::operator<<((ostream *)poVar1,local_24);
    poVar1 = std::operator<<(local_1a0,"; Expected: ");
    poVar1 = operator<<(poVar1,*(Code *)fileName_local);
    poVar1 = std::operator<<(poVar1,"; Actual: ");
    operator<<(poVar1,*expected_local);
    this = (AssertionException *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    message = (char *)std::__cxx11::string::c_str();
    AssertionException::AssertionException(this,message);
    __cxa_throw(this,&AssertionException::typeinfo,AssertionException::~AssertionException);
  }
  return;
}

Assistant:

void AssertEqual(Actual&& actual, Expected&& expected, const char* fileName, int lineNumber)
{
    if (expected != actual)
    {
        std::stringstream msg;
        msg << "Equality assumption is broken: file '" << fileName << "'; line " << lineNumber;
        msg << "; Expected: " << expected << "; Actual: " << actual;
        throw AssertionException(msg.str().c_str());
    }
}